

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::initialize(DeepScanLineInputFile *this,Header *header)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int i;
  int iVar4;
  int iVar5;
  Format FVar6;
  string *__lhs;
  int *piVar7;
  LineOrder *pLVar8;
  Box2i *pBVar9;
  Compression *pCVar10;
  Compressor *pCVar11;
  LineBuffer *pLVar12;
  ChannelList *this_00;
  const_iterator cVar13;
  ConstIterator CVar14;
  ostream *poVar15;
  ArgExc *pAVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  Data *pDVar20;
  ConstIterator tmp;
  ulong uVar21;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  __lhs = Header::type_abi_cxx11_(header);
  bVar3 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )DEEPSCANLINE_abi_cxx11_);
  if (bVar3) {
    pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar16,"Can\'t build a DeepScanLineInputFile from a type-mismatched part.");
  }
  else {
    if (this->_data->partNumber != -1) {
LAB_00161dba:
      piVar7 = Header::version(header);
      if (*piVar7 != 1) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar15 = std::operator<<(local_1a8,"Version ");
        piVar7 = Header::version(header);
        poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,*piVar7);
        std::operator<<(poVar15,
                        " not supported for deepscanline images in this version of the library");
        pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar16,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar16,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      Header::operator=(&this->_data->header,header);
      pLVar8 = Header::lineOrder(&this->_data->header);
      pDVar20 = this->_data;
      pDVar20->lineOrder = *pLVar8;
      pBVar9 = Header::dataWindow(&pDVar20->header);
      iVar5 = (pBVar9->min).x;
      pDVar20 = this->_data;
      pDVar20->minX = iVar5;
      iVar2 = (pBVar9->max).x;
      pDVar20->maxX = iVar2;
      iVar17 = (pBVar9->min).y;
      pDVar20->minY = iVar17;
      iVar4 = (pBVar9->max).y;
      pDVar20->maxY = iVar4;
      lVar18 = (long)((iVar2 - iVar5) + 1);
      lVar19 = (long)((iVar4 - iVar17) + 1);
      if ((ulong)(lVar19 * lVar18) < 0x10000001) {
        Array2D<unsigned_int>::resizeErase(&pDVar20->sampleCount,lVar19,lVar18);
        pDVar20 = this->_data;
        iVar17 = pDVar20->minY;
        iVar4 = pDVar20->maxY;
      }
      else {
        pDVar20->bigFile = true;
      }
      Array<unsigned_int>::resizeErase(&pDVar20->lineSampleCount,(long)((iVar4 - iVar17) + 1));
      pCVar10 = Header::compression(&this->_data->header);
      pCVar11 = newCompressor(*pCVar10,0,&this->_data->header);
      iVar5 = numLinesInBuffer(pCVar11);
      pDVar20 = this->_data;
      pDVar20->linesInBuffer = iVar5;
      if (pCVar11 != (Compressor *)0x0) {
        (*pCVar11->_vptr_Compressor[1])(pCVar11);
        pDVar20 = this->_data;
        iVar5 = pDVar20->linesInBuffer;
      }
      pDVar20->nextLineBufferMinY = pDVar20->minY + -1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&pDVar20->lineOffsets,(long)((((pBVar9->max).y - (pBVar9->min).y) + iVar5) / iVar5)
                );
      for (uVar21 = 0; pDVar20 = this->_data,
          uVar21 < (ulong)((long)(pDVar20->lineBuffers).
                                 super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pDVar20->lineBuffers).
                                 super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar21 = uVar21 + 1) {
        pLVar12 = (LineBuffer *)operator_new(0xa0);
        pLVar12->compressor = (Compressor *)0x0;
        pLVar12->uncompressedData = (char *)0x0;
        pLVar12->buffer = (char *)0x0;
        pLVar12->packedDataSize = 0;
        FVar6 = defaultFormat((Compressor *)0x0);
        pLVar12->format = FVar6;
        pLVar12->number = -1;
        pLVar12->hasException = false;
        (pLVar12->exception)._M_dataplus._M_p = (pointer)&(pLVar12->exception).field_2;
        (pLVar12->exception)._M_string_length = 0;
        (pLVar12->exception).field_2._M_local_buf[0] = '\0';
        (pLVar12->_tempCountBuffer)._sizeX = 0;
        (pLVar12->_tempCountBuffer)._sizeY = 0;
        (pLVar12->_tempCountBuffer)._data = (uint *)0x0;
        IlmThread_3_2::Semaphore::Semaphore(&pLVar12->_sem,1);
        (this->_data->lineBuffers).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar21] = pLVar12;
      }
      Array<bool>::resizeErase(&pDVar20->gotSampleCount,(long)((pDVar20->maxY - pDVar20->minY) + 1))
      ;
      pDVar20 = this->_data;
      lVar19 = (long)pDVar20->maxY - (long)pDVar20->minY;
      for (lVar18 = 0; lVar18 <= lVar19; lVar18 = lVar18 + 1) {
        (pDVar20->gotSampleCount)._data[lVar18] = false;
      }
      lVar19 = lVar19 + 1;
      lVar18 = (long)pDVar20->linesInBuffer;
      if (lVar19 < pDVar20->linesInBuffer) {
        lVar18 = lVar19;
      }
      lVar18 = lVar18 * (((long)pDVar20->maxX - (long)pDVar20->minX) + 1);
      lVar19 = lVar18 * 4;
      if (lVar19 < 0x80000000) {
        pDVar20->maxSampleCountTableSize = (int)lVar19;
        Array<char>::resizeErase(&pDVar20->sampleCountTableBuffer,(lVar18 << 0x22) >> 0x20);
        pCVar10 = Header::compression(&this->_data->header);
        pCVar11 = newCompressor(*pCVar10,(long)this->_data->maxSampleCountTableSize,
                                &this->_data->header);
        pDVar20 = this->_data;
        pDVar20->sampleCountTableComp = pCVar11;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&pDVar20->bytesPerLine,(long)((pDVar20->maxY - pDVar20->minY) + 1));
        this_00 = Header::channels(header);
        this->_data->combinedSampleSize = 0;
        cVar13._M_node = (_Base_ptr)ChannelList::begin(this_00);
        while( true ) {
          CVar14 = ChannelList::end(this_00);
          if ((const_iterator)cVar13._M_node == CVar14._i._M_node) {
            return;
          }
          if (2 < (ulong)cVar13._M_node[9]._M_color) break;
          piVar7 = &this->_data->combinedSampleSize;
          *piVar7 = *piVar7 + *(int *)(&DAT_001f91b8 + (ulong)cVar13._M_node[9]._M_color * 4);
          cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar15 = std::operator<<(local_1a8,"Bad type for channel ");
        poVar15 = std::operator<<(poVar15,(char *)(cVar13._M_node + 1));
        std::operator<<(poVar15," initializing deepscanline reader");
        pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar16,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar16,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar15 = std::operator<<(local_1a8,"Deep scanline image size ");
      poVar15 = std::ostream::_M_insert<long>((long)poVar15);
      poVar15 = std::operator<<(poVar15," x ");
      poVar15 = std::ostream::_M_insert<long>((long)poVar15);
      std::operator<<(poVar15," exceeds maximum size");
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar16,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar16,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    uVar1 = this->_data->version;
    if ((uVar1 >> 9 & 1) == 0) {
      if ((uVar1 >> 0xb & 1) != 0) goto LAB_00161dba;
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar16,"Expected a deep scanline file but the file is not a deep image.");
    }
    else {
      pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar16,"Expected a deep scanline file but the file is tiled.");
    }
  }
  __cxa_throw(pAVar16,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::initialize (const Header& header)
{
    try
    {
        if (header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineInputFile from "
                "a type-mismatched part.");

        if (_data->partNumber == -1)
        {
            if (isTiled (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is tiled.");

            if (!isNonImage (_data->version))
                throw IEX_NAMESPACE::ArgExc (
                    "Expected a deep scanline file but the file is not a deep image.");
        }

        if (header.version () != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Version "
                    << header.version ()
                    << " not supported for deepscanline images in this version of the library");
        }

        _data->header = header;

        _data->lineOrder = _data->header.lineOrder ();

        const Box2i& dataWindow = _data->header.dataWindow ();

        _data->minX = dataWindow.min.x;
        _data->maxX = dataWindow.max.x;
        _data->minY = dataWindow.min.y;
        _data->maxY = dataWindow.max.y;

        if (static_cast<uint64_t> (_data->maxX - _data->minX + 1) *
                static_cast<uint64_t> (_data->maxY - _data->minY + 1) >
            gBigFileDataWindowSize)
        {
            _data->bigFile = true;
        }
        else
        {
            _data->sampleCount.resizeErase (
                _data->maxY - _data->minY + 1, _data->maxX - _data->minX + 1);
        }
        _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

        Compressor* compressor =
            newCompressor (_data->header.compression (), 0, _data->header);

        _data->linesInBuffer = numLinesInBuffer (compressor);

        delete compressor;

        _data->nextLineBufferMinY = _data->minY - 1;

        int lineOffsetSize =
            (dataWindow.max.y - dataWindow.min.y + _data->linesInBuffer) /
            _data->linesInBuffer;

        _data->lineOffsets.resize (lineOffsetSize);

        for (size_t i = 0; i < _data->lineBuffers.size (); i++)
            _data->lineBuffers[i] = new LineBuffer ();

        _data->gotSampleCount.resizeErase (_data->maxY - _data->minY + 1);
        for (int i = 0; i < _data->maxY - _data->minY + 1; i++)
            _data->gotSampleCount[i] = false;

        int64_t imageHeight = static_cast<int64_t>(_data->maxY) - static_cast<int64_t>(_data->minY) + 1;
        int64_t imageWidth = static_cast<int64_t>(_data->maxX) - static_cast<int64_t>(_data->minX) +1;

        int64_t tableSize =  min (static_cast<int64_t>(_data->linesInBuffer), imageHeight) * imageWidth
            * sizeof (unsigned int);

        if (tableSize>std::numeric_limits<int>::max() )
        {
             THROW (IEX_NAMESPACE::ArgExc,
                    "Deep scanline image size "
                    << imageWidth << " x " <<  imageHeight
                    << " exceeds maximum size");
        }
        _data->maxSampleCountTableSize =tableSize;



        _data->sampleCountTableBuffer.resizeErase (
            _data->maxSampleCountTableSize);

        _data->sampleCountTableComp = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);

        _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

        const ChannelList& c = header.channels ();

        _data->combinedSampleSize = 0;
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            switch (i.channel ().type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    _data->combinedSampleSize += Xdr::size<half> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    _data->combinedSampleSize += Xdr::size<float> ();
                    break;
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    _data->combinedSampleSize += Xdr::size<unsigned int> ();
                    break;
                default:
                    THROW (
                        IEX_NAMESPACE::ArgExc,
                        "Bad type for channel "
                            << i.name ()
                            << " initializing deepscanline reader");
            }
        }
    }
    catch (...)
    {
        // Don't delete _data here, leave that to caller
        throw;
    }
}